

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disjunctive.cpp
# Opt level: O2

bool __thiscall DisjunctiveEF::propagate(DisjunctiveEF *this)

{
  bool bVar1;
  int iVar2;
  
  (this->super_Propagator).field_0x12 = 0;
  std::__sort<int*,__gnu_cxx::__ops::_Iter_comp_iter<DisjunctiveEF::SortEstAsc>>
            (this->ests,this->ests + (this->x).sz,
             (_Iter_comp_iter<DisjunctiveEF::SortEstAsc>)(this->sort_est_asc).p);
  std::__sort<int*,__gnu_cxx::__ops::_Iter_comp_iter<DisjunctiveEF::SortLetDsc>>
            (this->lets,this->lets + (this->x).sz,
             (_Iter_comp_iter<DisjunctiveEF::SortLetDsc>)(this->sort_let_dsc).p);
  if (so.disj_edge_find == true) {
    bVar1 = doEdgeFinding(this);
    if (bVar1) goto LAB_00155ced;
LAB_00155d06:
    bVar1 = false;
  }
  else {
LAB_00155ced:
    if (so.disj_set_bp == true) {
      iVar2 = (*(this->bp->super_Propagator)._vptr_Propagator[3])();
      if ((char)iVar2 == '\0') goto LAB_00155d06;
    }
    bVar1 = true;
  }
  return bVar1;
}

Assistant:

bool propagate() override {
		trailed_pinfo_sz = false;

		// sort vars based on est and let
		std::sort(ests, ests + x.size(), sort_est_asc);
		std::sort(lets, lets + x.size(), sort_let_dsc);

		//		if (!findBasicPrecedences()) return false;
		if (so.disj_edge_find && !doEdgeFinding()) {
			return false;
		}
		if (so.disj_set_bp && !bp->propagate()) {
			return false;
		}

		return true;
	}